

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O0

void QNetworkInformationPrivate::removeFromList(QNetworkInformationBackendFactory *factory)

{
  long lVar1;
  bool bVar2;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::exists
                    ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                      *)0x231277);
  if (bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_> *)
               0x2312a1);
    QMutexLocker<QMutex>::QMutexLocker(in_RDI,in_stack_ffffffffffffffd8);
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::operator->
              ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_> *)
               0x2312ba);
    QList<QNetworkInformationBackendFactory*>::removeAll<QNetworkInformationBackendFactory*>
              ((QList<QNetworkInformationBackendFactory_*> *)in_RDI,
               (QNetworkInformationBackendFactory **)in_stack_ffffffffffffffd8);
    QMutexLocker<QMutex>::~QMutexLocker(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkInformationPrivate::removeFromList(QNetworkInformationBackendFactory *factory)
{
    // @note: factory is in the base class dtor
    if (!dataHolder.exists())
        return;
    QMutexLocker locker(&dataHolder->instanceMutex);
    dataHolder->factories.removeAll(factory);
}